

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O1

void __thiscall
mp::internal::NLFileReader<fmt::File>::Read
          (NLFileReader<fmt::File> *this,MemoryBuffer<char,_1UL,_std::allocator<char>_> *array)

{
  ssize_t sVar1;
  size_t in_RCX;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->size_ + 1;
  if ((array->super_Buffer<char>).capacity_ < uVar2) {
    (**(array->super_Buffer<char>)._vptr_Buffer)(array,uVar2);
  }
  (array->super_Buffer<char>).size_ = uVar2;
  uVar2 = this->size_;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      sVar1 = fmt::File::read(&this->file_,(int)(array->super_Buffer<char>).ptr_ + (int)uVar3,
                              (void *)(uVar2 - uVar3),in_RCX);
      uVar3 = uVar3 + sVar1;
      uVar2 = this->size_;
    } while (uVar3 < uVar2);
  }
  (array->super_Buffer<char>).ptr_[uVar2] = '\0';
  return;
}

Assistant:

void mp::internal::NLFileReader<File>::Read(
    fmt::internal::MemoryBuffer<char, 1> &array) {
  array.resize(size_ + 1);
  std::size_t offset = 0;
  while (offset < size_)
    offset += file_.read(&array[offset], size_ - offset);
  array[size_] = 0;
}